

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
          (Stack *this,FrameKind args,LocationRange *args_1)

{
  Frame *__last;
  pointer __first;
  pointer __result;
  pointer pFVar1;
  pointer pFVar2;
  undefined4 in_register_00000034;
  LocationRange *location;
  LocationRange *__n;
  FrameKind local_44;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
  *local_40;
  pointer local_38;
  
  location = (LocationRange *)CONCAT44(in_register_00000034,args);
  local_44 = FRAME_INVARIANTS;
  __last = *(Frame **)(this + 0x18);
  if (__last == *(Frame **)(this + 0x20)) {
    __n = location;
    local_40 = (_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                *)std::
                  vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                  ::_M_check_len((vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                  *)(this + 0x10),(size_type)location,(char *)args_1);
    __first = *(pointer *)(this + 0x10);
    pFVar2 = *(pointer *)(this + 0x18);
    local_38 = pFVar2;
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate(local_40,(size_t)__n);
    anon_unknown_0::Frame::Frame
              ((Frame *)(((long)__last - (long)__first) + (long)__result),&local_44,location);
    pFVar1 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,__last,__result,(_Tp_alloc_type *)pFVar2);
    pFVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__last,local_38,pFVar1 + 1,(_Tp_alloc_type *)pFVar2);
    if (__first != (pointer)0x0) {
      operator_delete(__first,*(long *)(this + 0x20) - (long)__first);
    }
    *(pointer *)(this + 0x10) = __result;
    *(pointer *)(this + 0x18) = pFVar2;
    *(pointer *)(this + 0x20) = __result + (long)local_40;
  }
  else {
    anon_unknown_0::Frame::Frame(__last,&local_44,location);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 400;
  }
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }